

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  long lVar1;
  BlockEntry *pBVar2;
  Tracks *pTVar3;
  Track *pTVar4;
  int iVar5;
  long lVar6;
  Block *pBVar7;
  longlong lVar8;
  BlockEntry **ppBVar9;
  undefined4 extraout_var_00;
  Track **ppTVar10;
  long lVar11;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  undefined4 extraout_var;
  
  if (this->m_pSegment == (Segment *)0x0) {
    __assert_fail("m_pSegment",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1d50,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                 );
  }
  lVar1 = cp->m_timecode;
  lVar11 = tp->m_block;
  if (lVar11 < 1) {
LAB_00112a7e:
    lVar11 = 0;
    while( true ) {
      if (lVar11 < this->m_entries_count) {
        ppBVar9 = this->m_entries;
      }
      else {
        lVar6 = Parse(this,&local_38,&local_40);
        if (lVar6 != 0) {
          return (BlockEntry *)0x0;
        }
        ppBVar9 = this->m_entries;
        if (ppBVar9 == (BlockEntry **)0x0) {
          __assert_fail("m_entries",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d80,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        if (this->m_entries_count <= lVar11) {
          __assert_fail("index < m_entries_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d81,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
      }
      pBVar2 = ppBVar9[lVar11];
      if (pBVar2 == (BlockEntry *)0x0) {
        __assert_fail("pEntry",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d85,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
      iVar5 = (*pBVar2->_vptr_BlockEntry[3])(pBVar2);
      if (iVar5 == 0) {
        __assert_fail("!pEntry->EOS()",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d86,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
      iVar5 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
      pBVar7 = (Block *)CONCAT44(extraout_var_00,iVar5);
      if (pBVar7 == (Block *)0x0) {
        __assert_fail("pBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d89,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
      if ((pBVar7->m_track == tp->m_track) &&
         (lVar8 = Block::GetTimeCode(pBVar7,this), lVar1 <= lVar8)) break;
      lVar11 = lVar11 + 1;
    }
    if (lVar8 <= lVar1) {
      pTVar3 = this->m_pSegment->m_pTracks;
      if (pTVar3 == (Tracks *)0x0) {
        __assert_fail("pTracks",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d9b,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
      if (-1 < tp->m_track) {
        for (ppTVar10 = pTVar3->m_trackEntries; ppTVar10 != pTVar3->m_trackEntriesEnd;
            ppTVar10 = ppTVar10 + 1) {
          pTVar4 = *ppTVar10;
          if ((pTVar4 != (Track *)0x0) && ((pTVar4->m_info).number == tp->m_track)) {
            lVar1 = (pTVar4->m_info).type;
            if (lVar1 == 1) {
              if ((char)pBVar7->m_flags < '\0') {
                return pBVar2;
              }
              return (BlockEntry *)0x0;
            }
            if (lVar1 != 2) {
              return (BlockEntry *)0x0;
            }
            return pBVar2;
          }
        }
      }
    }
  }
  else {
    do {
      if (lVar11 <= this->m_entries_count) {
        pBVar2 = this->m_entries[lVar11 + -1];
        if (pBVar2 == (BlockEntry *)0x0) {
          __assert_fail("pEntry",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d65,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        iVar5 = (*pBVar2->_vptr_BlockEntry[3])(pBVar2);
        if (iVar5 == 0) {
          __assert_fail("!pEntry->EOS()",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d66,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        iVar5 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
        pBVar7 = (Block *)CONCAT44(extraout_var,iVar5);
        if (pBVar7 == (Block *)0x0) {
          __assert_fail("pBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d69,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        if ((pBVar7->m_track == tp->m_track) &&
           (lVar8 = Block::GetTimeCode(pBVar7,this), lVar8 == lVar1)) {
          return pBVar2;
        }
        goto LAB_00112a7e;
      }
      lVar6 = Parse(this,&local_38,&local_40);
    } while ((-1 < lVar6) && (lVar6 == 0));
  }
  return (BlockEntry *)0x0;
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}